

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImRect local_d8;
  ImRect local_c8;
  undefined1 local_b8 [8];
  ImRect r_avoid_2;
  ImRect r_outer_2;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid_1;
  ImRect r_outer_1;
  ImVec2 local_64;
  ImRect local_5c;
  undefined1 local_4c [8];
  ImRect r_avoid;
  ImRect r_outer;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar4 = GImGui;
  if ((window->Flags & 0x10000000U) == 0) {
    if ((window->Flags & 0x4000000U) == 0) {
      if ((window->Flags & 0x2000000U) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x22cc,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      ref_pos.x = (GImGui->Style).MouseCursorScale;
      r_outer_2.Max = NavCalcPreferredRefPos();
      join_0x00001240_0x00001200_ = GetWindowAllowedExtentRect(window);
      ImRect::ImRect((ImRect *)local_b8);
      if ((((pIVar4->NavDisableHighlight & 1U) == 0) && ((pIVar4->NavDisableMouseHover & 1U) != 0))
         && (((pIVar4->IO).ConfigFlags & 4U) == 0)) {
        ImRect::ImRect(&local_c8,r_outer_2.Max.x - 16.0,r_outer_2.Max.y - 8.0,r_outer_2.Max.x + 16.0
                       ,r_outer_2.Max.y + 8.0);
        local_b8._0_4_ = local_c8.Min.x;
        local_b8._4_4_ = local_c8.Min.y;
        r_avoid_2.Min = local_c8.Max;
      }
      else {
        ImRect::ImRect(&local_d8,r_outer_2.Max.x - 16.0,r_outer_2.Max.y - 8.0,
                       ref_pos.x * 24.0 + r_outer_2.Max.x,ref_pos.x * 24.0 + r_outer_2.Max.y);
        local_b8._0_4_ = local_d8.Min.x;
        local_b8._4_4_ = local_d8.Min.y;
        r_avoid_2.Min = local_d8.Max;
      }
      window_local = (ImGuiWindow *)
                     FindBestWindowPosForPopupEx
                               (&r_outer_2.Max,&window->Size,&window->AutoPosLastDirection,
                                (ImRect *)&r_avoid_2.Max,(ImRect *)local_b8,
                                ImGuiPopupPositionPolicy_Tooltip);
    }
    else {
      join_0x00001240_0x00001200_ = GetWindowAllowedExtentRect(window);
      fVar1 = (window->Pos).x;
      fVar2 = (window->Pos).y;
      ImRect::ImRect((ImRect *)&ref_pos.y,fVar1 - 1.0,fVar2 - 1.0,fVar1 + 1.0,fVar2 + 1.0);
      window_local = (ImGuiWindow *)
                     FindBestWindowPosForPopupEx
                               (&window->Pos,&window->Size,&window->AutoPosLastDirection,
                                (ImRect *)&r_avoid_1.Max,(ImRect *)&ref_pos.y,
                                ImGuiPopupPositionPolicy_Default);
    }
  }
  else {
    pIVar3 = window->ParentWindow;
    fVar1 = (GImGui->Style).ItemInnerSpacing.x;
    join_0x00001240_0x00001200_ = GetWindowAllowedExtentRect(window);
    ImRect::ImRect((ImRect *)local_4c);
    if (((pIVar3->DC).MenuBarAppending & 1U) == 0) {
      ImRect::ImRect((ImRect *)&r_outer_1.Max,(pIVar3->Pos).x + fVar1,-3.4028235e+38,
                     (((pIVar3->Pos).x + (pIVar3->Size).x) - fVar1) - (pIVar3->ScrollbarSizes).x,
                     3.4028235e+38);
      local_4c._0_4_ = r_outer_1.Max.x;
      local_4c._4_4_ = r_outer_1.Max.y;
      r_avoid.Min = local_64;
    }
    else {
      ImRect::ImRect(&local_5c,-3.4028235e+38,(pIVar3->ClipRect).Min.y,3.4028235e+38,
                     (pIVar3->ClipRect).Max.y);
      local_4c._0_4_ = local_5c.Min.x;
      local_4c._4_4_ = local_5c.Min.y;
      r_avoid.Min = local_5c.Max;
    }
    window_local = (ImGuiWindow *)
                   FindBestWindowPosForPopupEx
                             (&window->Pos,&window->Size,&window->AutoPosLastDirection,
                              (ImRect *)&r_avoid.Max,(ImRect *)local_4c,
                              ImGuiPopupPositionPolicy_Default);
  }
  return (ImVec2)window_local;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        ImGuiWindow* parent_window = window->ParentWindow;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}